

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpotController.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_5ea27a::SpotController::collective_flush
          (SpotController *this,OutputStream *stream,Comm *comm)

{
  string *psVar1;
  anon_union_8_7_33918203_for_value aVar2;
  code *pcVar3;
  byte *pbVar4;
  long lVar5;
  undefined8 uVar6;
  CaliperMetadataDB *pCVar7;
  element_type *peVar8;
  uint uVar9;
  bool bVar10;
  int iVar11;
  StreamType SVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  ostream *poVar16;
  long *plVar17;
  Node *pNVar18;
  ChannelBody *pCVar19;
  ChannelController *pCVar20;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar21;
  code **__dest;
  char *pcVar22;
  Node *pNVar23;
  size_t sVar24;
  pointer pEVar25;
  ulong uVar26;
  char *ext;
  AggregationOp *extraout_RDX;
  AggregationOp *extraout_RDX_00;
  AggregationOp *extraout_RDX_01;
  AggregationOp *extraout_RDX_02;
  AggregationOp *extraout_RDX_03;
  AggregationOp *extraout_RDX_04;
  AggregationOp *extraout_RDX_05;
  AggregationOp *extraout_RDX_06;
  AggregationOp *pAVar27;
  uint __val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *o;
  undefined1 auVar28 [8];
  undefined8 uVar29;
  uint __len;
  Caliper c_1;
  string output;
  Variant v_data;
  Aggregator output_agg;
  CaliWriter writer;
  Attribute chn_attr;
  Aggregator summary_cross_agg;
  Aggregator cross_agg;
  ChannelPtr p;
  vector<(anonymous_namespace)::LoopInfo,_std::allocator<(anonymous_namespace)::LoopInfo>_> infovec;
  size_type __dnew_1;
  string outdir;
  Caliper c;
  _Any_data local_3e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3d8;
  _Any_data local_3c8;
  code *local_3b8;
  code *pcStack_3b0;
  CaliperMetadataDB *local_3a8;
  undefined1 local_3a0 [16];
  undefined1 local_390 [40];
  Aggregator local_368;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_358;
  ChannelController *local_348;
  Options *local_340;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_338;
  undefined8 local_330;
  Node *local_328;
  CaliWriter local_320;
  Channel local_310;
  ChannelController *local_300;
  Aggregator local_2f8;
  Aggregator local_2e8;
  ConfigManager local_2d8;
  undefined1 local_2c8 [32];
  SnapshotProcessFn local_2a8;
  undefined1 local_280 [8];
  undefined1 local_278 [8];
  Node local_270;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_228;
  vector<cali::QuerySpec::Condition,_std::allocator<cali::QuerySpec::Condition>_> local_200;
  vector<cali::QuerySpec::SortSpec,_std::allocator<cali::QuerySpec::SortSpec>_> local_1d8 [3];
  undefined1 local_190 [48];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_160;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_130;
  vector<cali::QuerySpec::PreprocessSpec,_std::allocator<cali::QuerySpec::PreprocessSpec>_>
  local_100 [5];
  int local_80;
  Attribute *local_78;
  Node *local_70;
  Caliper local_68;
  vector<cali::Entry,_std::allocator<cali::Entry>_> local_48;
  
  bVar10 = cali::ChannelController::is_instantiated((ChannelController *)this);
  poVar16 = (ostream *)local_280;
  if (bVar10) {
    std::ofstream::ofstream(poVar16);
    local_80 = 1;
    iVar11 = cali::Log::verbosity();
    if (local_80 <= iVar11) {
      poVar16 = cali::Log::get_stream((Log *)local_280);
    }
    cali::ChannelController::name_abi_cxx11_((string *)&local_3c8,(ChannelController *)this);
    local_390._24_8_ = comm;
    poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar16,(char *)local_3c8._M_unused._0_8_,local_3c8._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar16,": Flushing Caliper data",0x17);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar16 + -0x18) + (char)poVar16);
    std::ostream::put((char)poVar16);
    std::ostream::flush();
    if ((code **)local_3c8._M_unused._0_8_ != &local_3b8) {
      operator_delete(local_3c8._M_unused._M_object,(ulong)(local_3b8 + 1));
    }
    local_280 = (undefined1  [8])_VTT;
    local_328 = _VTT;
    local_330 = ___throw_bad_array_new_length;
    *(undefined8 *)(local_280 + _VTT[-1].m_attribute) = ___throw_bad_array_new_length;
    std::filebuf::~filebuf((filebuf *)local_278);
    std::ios_base::~ios_base((ios_base *)(local_190 + 8));
    SVar12 = cali::OutputStream::type(stream);
    local_390._16_8_ = this;
    if (SVar12 == None) {
      cali::ConfigManager::Options::get_abi_cxx11_((string *)local_280,&this->m_opts,"outdir","");
      cali::ConfigManager::Options::get_abi_cxx11_((string *)&local_3c8,&this->m_opts,"output","");
      if ((code *)local_3c8._8_8_ == (code *)0x0) {
        cali::util::create_filename_abi_cxx11_((string *)&local_3e8,(util *)".cali",ext);
        std::__cxx11::string::operator=
                  ((string *)local_3c8._M_pod_data,(string *)local_3e8._M_pod_data);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3e8._M_unused._0_8_ != &local_3d8) {
          operator_delete(local_3e8._M_unused._M_object,
                          CONCAT35(local_3d8._M_allocated_capacity._5_3_,
                                   local_3d8._M_allocated_capacity._0_5_) + 1);
        }
      }
      if (((local_278 != (undefined1  [8])0x0) &&
          (iVar11 = std::__cxx11::string::compare(local_3c8._M_pod_data), iVar11 != 0)) &&
         (iVar11 = std::__cxx11::string::compare(local_3c8._M_pod_data), iVar11 != 0)) {
        local_358._M_allocated_capacity._0_2_ = 0x2f;
        local_368.mP.
        super___shared_ptr<cali::Aggregator::AggregatorImpl,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1;
        local_368.mP.
        super___shared_ptr<cali::Aggregator::AggregatorImpl,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)&local_358;
        plVar17 = (long *)std::__cxx11::string::replace
                                    ((ulong)&local_368,0,(char *)0x0,(ulong)local_280);
        pEVar25 = (pointer)(plVar17 + 2);
        if ((pointer)*plVar17 == pEVar25) {
          local_390._0_8_ = pEVar25->m_node;
          local_390._8_8_ = plVar17[3];
          local_3a0._0_8_ = (pointer)local_390;
        }
        else {
          local_390._0_8_ = pEVar25->m_node;
          local_3a0._0_8_ = (pointer)*plVar17;
        }
        local_3a0._8_8_ = *(anon_union_8_7_33918203_for_value *)(plVar17 + 1);
        *plVar17 = (long)pEVar25;
        plVar17[1] = 0;
        *(undefined1 *)(plVar17 + 2) = 0;
        plVar17 = (long *)std::__cxx11::string::_M_append
                                    (local_3a0,local_3c8._M_unused._M_member_pointer);
        paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar17 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar17 == paVar21) {
          lVar5 = plVar17[3];
          local_3d8._M_allocated_capacity._0_5_ = (undefined5)paVar21->_M_allocated_capacity;
          local_3d8._M_allocated_capacity._5_3_ =
               (undefined3)(paVar21->_M_allocated_capacity >> 0x28);
          local_3d8._8_4_ = (undefined4)lVar5;
          local_3d8._M_local_buf[0xc] = (char)((ulong)lVar5 >> 0x20);
          local_3d8._M_local_buf[0xd] = (char)((ulong)lVar5 >> 0x28);
          local_3d8._14_2_ = (undefined2)((ulong)lVar5 >> 0x30);
          local_3e8._M_unused._M_object = &local_3d8;
        }
        else {
          local_3d8._M_allocated_capacity._0_5_ = (undefined5)paVar21->_M_allocated_capacity;
          local_3d8._M_allocated_capacity._5_3_ =
               (undefined3)(paVar21->_M_allocated_capacity >> 0x28);
          local_3e8._M_unused._M_object =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*plVar17;
        }
        local_3e8._8_8_ = plVar17[1];
        *plVar17 = (long)paVar21;
        plVar17[1] = 0;
        *(undefined1 *)(plVar17 + 2) = 0;
        std::__cxx11::string::operator=
                  ((string *)local_3c8._M_pod_data,(string *)local_3e8._M_pod_data);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3e8._M_unused._0_8_ != &local_3d8) {
          operator_delete(local_3e8._M_unused._M_object,
                          CONCAT35(local_3d8._M_allocated_capacity._5_3_,
                                   local_3d8._M_allocated_capacity._0_5_) + 1);
        }
        if ((pointer)local_3a0._0_8_ != (pointer)local_390) {
          operator_delete((void *)local_3a0._0_8_,(ulong)(local_390._0_8_ + 1));
        }
        this = (SpotController *)local_390._16_8_;
        if (local_368.mP.
            super___shared_ptr<cali::Aggregator::AggregatorImpl,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            != (element_type *)&local_358) {
          operator_delete(local_368.mP.
                          super___shared_ptr<cali::Aggregator::AggregatorImpl,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr,CONCAT62(local_358._M_allocated_capacity._2_6_,
                                           local_358._M_allocated_capacity._0_2_) + 1);
        }
      }
      cali::Caliper::Caliper((Caliper *)&local_3e8);
      cali::OutputStream::OutputStream((OutputStream *)&local_368);
      uVar6 = local_3c8._M_unused._0_8_;
      cali::Caliper::get_globals
                ((vector<cali::Entry,_std::allocator<cali::Entry>_> *)local_3a0,
                 (Caliper *)&local_3e8);
      cali::OutputStream::set_filename
                ((OutputStream *)&local_368,(char *)uVar6,
                 (CaliperMetadataAccessInterface *)&local_3e8,
                 (vector<cali::Entry,_std::allocator<cali::Entry>_> *)local_3a0);
      if ((pointer)local_3a0._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_3a0._0_8_,local_390._0_8_ - local_3a0._0_8_);
      }
      if ((code **)local_3c8._M_unused._0_8_ != &local_3b8) {
        operator_delete(local_3c8._M_unused._M_object,(ulong)(local_3b8 + 1));
      }
      if (local_280 != (undefined1  [8])&local_270) {
        operator_delete((void *)local_280,
                        CONCAT35(local_270.super_LockfreeIntrusiveTree<cali::Node>.m_me._5_3_,
                                 local_270.super_LockfreeIntrusiveTree<cali::Node>.m_me._0_5_) + 1);
      }
      (stream->mP).
      super___shared_ptr<cali::OutputStream::OutputStreamImpl,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           local_368.mP.
           super___shared_ptr<cali::Aggregator::AggregatorImpl,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(stream->mP).
                  super___shared_ptr<cali::OutputStream::OutputStreamImpl,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount,
                 &local_368.mP.
                  super___shared_ptr<cali::Aggregator::AggregatorImpl,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      cali::OutputStream::~OutputStream((OutputStream *)&local_368);
    }
    cali::Caliper::Caliper(&local_68);
    cali::CaliWriter::CaliWriter(&local_320,stream);
    local_280 = (undefined1  [8])&local_270;
    local_3e8._M_unused._M_member_pointer = 0x10c;
    pNVar18 = (Node *)std::__cxx11::string::_M_create((ulong *)local_280,(ulong)&local_3e8);
    uVar6 = local_3e8._M_unused._0_8_;
    local_270.super_LockfreeIntrusiveTree<cali::Node>.m_me._0_5_ =
         (undefined5)local_3e8._M_unused._M_member_pointer;
    local_270.super_LockfreeIntrusiveTree<cali::Node>.m_me._5_3_ =
         (undefined3)((ulong)local_3e8._0_8_ >> 0x28);
    local_280 = (undefined1  [8])pNVar18;
    memcpy(pNVar18,
           " select *,min(inclusive#sum#time.duration) as \"Min time/rank\" unit sec,max(inclusive#sum#time.duration) as \"Max time/rank\" unit sec,avg(inclusive#sum#time.duration) as \"Avg time/rank\" unit sec,sum(inclusive#sum#time.duration) as \"Total time\"    unit sec group by path "
           ,0x10c);
    local_278 = (undefined1  [8])uVar6;
    *(byte *)((long)&(pNVar18->super_LockfreeIntrusiveTree<cali::Node>).m_me + uVar6) = 0;
    local_340 = (Options *)((long)this + 0x18U);
    cali::ConfigManager::Options::build_query
              ((string *)&local_3c8,(Options *)((long)this + 0x18U),"cross",(string *)local_280);
    if (local_280 != (undefined1  [8])&local_270) {
      operator_delete((void *)local_280,
                      CONCAT35(local_270.super_LockfreeIntrusiveTree<cali::Node>.m_me._5_3_,
                               local_270.super_LockfreeIntrusiveTree<cali::Node>.m_me._0_5_) + 1);
    }
    parse_spec((QuerySpec *)local_280,(char *)local_3c8._M_unused._0_8_);
    cali::Aggregator::Aggregator(&local_368,(QuerySpec *)local_280);
    local_3a8 = (CaliperMetadataDB *)((long)this + 0x78);
    cali::CaliperMetadataDB::add_attribute_aliases
              (local_3a8,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&local_160);
    cali::CaliperMetadataDB::add_attribute_units
              (local_3a8,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&local_130);
    local_3a0._0_8_ = local_390;
    local_2a8.super__Function_base._M_functor._M_unused._M_member_pointer = 0x6e;
    pNVar18 = (Node *)std::__cxx11::string::_M_create((ulong *)local_3a0,(ulong)&local_2a8);
    uVar6 = local_2a8.super__Function_base._M_functor._M_unused._0_8_;
    local_390._0_8_ = local_2a8.super__Function_base._M_functor._M_unused._M_member_pointer;
    local_3a0._0_8_ = pNVar18;
    memcpy(pNVar18,
           " let sum#time.duration=scale(sum#time.duration.ns,1e-9) select inclusive_sum(sum#time.duration) group by path "
           ,0x6e);
    local_3a0._8_8_ = uVar6;
    *(undefined1 *)((long)&(pNVar18->super_LockfreeIntrusiveTree<cali::Node>).m_me + uVar6) = 0;
    cali::ConfigManager::Options::build_query
              ((string *)&local_3e8,local_340,"local",(string *)local_3a0);
    if ((Node *)local_3a0._0_8_ != (Node *)local_390) {
      operator_delete((void *)local_3a0._0_8_,(ulong)(local_390._0_8_ + 1));
    }
    uVar6 = local_3e8._M_unused._0_8_;
    pCVar19 = cali::ChannelController::channel_body((ChannelController *)this);
    local_aggregate((char *)uVar6,&local_68,pCVar19,local_3a8,&local_368);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e8._M_unused._0_8_ != &local_3d8) {
      operator_delete(local_3e8._M_unused._M_object,
                      CONCAT35(local_3d8._M_allocated_capacity._5_3_,
                               local_3d8._M_allocated_capacity._0_5_) + 1);
    }
    (*(code *)(((LockfreeIntrusiveTree<cali::Node> *)local_390._24_8_)->m_me->m_treenode).head._M_b.
              _M_p)(local_390._24_8_,local_3a8,&local_368);
    iVar11 = (*(code *)((LockfreeIntrusiveTree<cali::Node> *)local_390._24_8_)->m_me->m_id)();
    if (iVar11 == 0) {
      *(size_type *)((long)this + 0x30) = 0;
      *(((string *)((long)this + 0x28))->_M_dataplus)._M_p = '\0';
      paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT35(local_270.super_LockfreeIntrusiveTree<cali::Node>.m_me._5_3_,
                            local_270.super_LockfreeIntrusiveTree<cali::Node>.m_me._0_5_);
      if (local_278 != (undefined1  [8])paVar21) {
        psVar1 = (string *)(local_390._16_8_ + 0x28);
        pAVar27 = extraout_RDX;
        auVar28 = local_278;
        do {
          if (*(size_type *)(local_390._16_8_ + 0x30) != 0) {
            std::__cxx11::string::append((char *)psVar1);
            pAVar27 = extraout_RDX_00;
          }
          cali::Aggregator::get_aggregation_attribute_name_abi_cxx11_
                    ((string *)&local_3e8,(Aggregator *)auVar28,pAVar27);
          std::__cxx11::string::_M_append((char *)psVar1,local_3e8._M_unused._M_member_pointer);
          pAVar27 = extraout_RDX_01;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3e8._M_unused._0_8_ != &local_3d8) {
            operator_delete(local_3e8._M_unused._M_object,
                            CONCAT35(local_3d8._M_allocated_capacity._5_3_,
                                     local_3d8._M_allocated_capacity._0_5_) + 1);
            pAVar27 = extraout_RDX_02;
          }
          auVar28 = (undefined1  [8])((long)auVar28 + 0x38);
        } while (auVar28 != (undefined1  [8])paVar21);
      }
      this = (SpotController *)local_390._16_8_;
      pCVar7 = local_3a8;
      local_3a0._0_8_ = (Node *)0xd72706504;
      local_3a0._8_8_ = "regionprofile";
      pNVar18 = cali::CaliperMetadataDB::make_tree_entry
                          (local_3a8,1,(Attribute *)(local_390._16_8_ + 0x88),(Variant *)local_3a0,
                           (Node *)0x0);
      uVar26 = (pNVar18->m_data).m_v.type_and_size;
      aVar2 = (pNVar18->m_data).m_v.value;
      local_3d8._M_allocated_capacity._0_5_ = 0;
      local_3d8._M_allocated_capacity._5_3_ = 0;
      local_3d8._8_4_ = 0;
      local_3d8._M_local_buf[0xc] = '\0';
      local_3d8._M_local_buf[0xd] = '\0';
      local_3d8._14_2_ = 0;
      local_3e8._M_unused._M_object = (void *)0x0;
      local_3e8._8_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      local_3e8._M_unused._M_object = operator_new(0x20);
      *(CaliWriter **)local_3e8._M_unused._0_8_ = &local_320;
      *(Node **)((long)local_3e8._M_unused._0_8_ + 8) = pNVar18;
      *(ulong *)((long)local_3e8._M_unused._0_8_ + 0x10) = uVar26;
      ((Node *)((long)local_3e8._M_unused._0_8_ + 0x18))->parent = (Node *)aVar2;
      local_3d8._8_4_ = 0x219f1e;
      local_3d8._M_local_buf[0xc] = '\0';
      local_3d8._M_local_buf[0xd] = '\0';
      local_3d8._14_2_ = 0;
      local_3d8._M_allocated_capacity._0_5_ = 0x219fa8;
      local_3d8._M_allocated_capacity._5_3_ = 0;
      cali::Aggregator::flush
                (&local_368,&pCVar7->super_CaliperMetadataAccessInterface,
                 (SnapshotProcessFn *)&local_3e8);
      if ((code *)CONCAT35(local_3d8._M_allocated_capacity._5_3_,
                           local_3d8._M_allocated_capacity._0_5_) != (code *)0x0) {
        (*(code *)CONCAT35(local_3d8._M_allocated_capacity._5_3_,
                           local_3d8._M_allocated_capacity._0_5_))(&local_3e8,&local_3e8,3);
      }
    }
    cali::Aggregator::~Aggregator(&local_368);
    std::vector<cali::QuerySpec::PreprocessSpec,_std::allocator<cali::QuerySpec::PreprocessSpec>_>::
    ~vector(local_100);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_130);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_160);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_190);
    std::vector<cali::QuerySpec::SortSpec,_std::allocator<cali::QuerySpec::SortSpec>_>::~vector
              (local_1d8);
    std::vector<cali::QuerySpec::Condition,_std::allocator<cali::QuerySpec::Condition>_>::~vector
              (&local_200);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_228);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_270.m_treenode.next);
    std::vector<cali::QuerySpec::AggregationOp,_std::allocator<cali::QuerySpec::AggregationOp>_>::
    ~vector((vector<cali::QuerySpec::AggregationOp,_std::allocator<cali::QuerySpec::AggregationOp>_>
             *)local_278);
    if ((code **)local_3c8._M_unused._0_8_ != &local_3b8) {
      operator_delete(local_3c8._M_unused._M_object,(ulong)(local_3b8 + 1));
    }
    bVar10 = cali::ConfigManager::Options::is_enabled(local_340,"timeseries");
    if (bVar10) {
      cali::ConfigManager::get_channel(&local_2d8,(char *)((long)this + 0x68));
      if (local_2d8.mP.
          super___shared_ptr<cali::ConfigManager::ConfigManagerImpl,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr == (element_type *)0x0) {
        poVar16 = (ostream *)local_280;
        std::ofstream::ofstream(poVar16);
        local_80 = 0;
        iVar11 = cali::Log::verbosity();
        if (local_80 <= iVar11) {
          poVar16 = cali::Log::get_stream((Log *)local_280);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar16,"[spot controller]: Timeseries channel not found!",0x30);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar16 + -0x18) + (char)poVar16);
        std::ostream::put((char)poVar16);
        std::ostream::flush();
        local_280 = (undefined1  [8])local_328;
        *(undefined8 *)(local_280 + local_328[-1].m_attribute) = local_330;
        std::filebuf::~filebuf((filebuf *)local_278);
        std::ios_base::~ios_base((ios_base *)(local_190 + 8));
      }
      else {
        pCVar20 = (ChannelController *)
                  __dynamic_cast(local_2d8.mP.
                                 super___shared_ptr<cali::ConfigManager::ConfigManagerImpl,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr,&cali::ChannelController::typeinfo,
                                 &(anonymous_namespace)::SpotTimeseriesController::typeinfo,0);
        local_348 = (ChannelController *)0x0;
        local_338 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if ((pCVar20 != (ChannelController *)0x0) &&
           (local_338 = local_2d8.mP.
                        super___shared_ptr<cali::ConfigManager::ConfigManagerImpl,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi, local_348 = pCVar20,
           local_2d8.mP.
           super___shared_ptr<cali::ConfigManager::ConfigManagerImpl,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_2d8.mP.
             super___shared_ptr<cali::ConfigManager::ConfigManagerImpl,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_2d8.mP.
                  super___shared_ptr<cali::ConfigManager::ConfigManagerImpl,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_2d8.mP.
             super___shared_ptr<cali::ConfigManager::ConfigManagerImpl,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_2d8.mP.
                  super___shared_ptr<cali::ConfigManager::ConfigManagerImpl,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        cali::CalQLParser::CalQLParser
                  ((CalQLParser *)&local_3c8,
                   "aggregate max(sum#loop.iterations),max(count) group by loop");
        cali::CalQLParser::spec((QuerySpec *)local_280,(CalQLParser *)&local_3c8);
        cali::Aggregator::Aggregator(&local_2f8,(QuerySpec *)local_280);
        std::
        vector<cali::QuerySpec::PreprocessSpec,_std::allocator<cali::QuerySpec::PreprocessSpec>_>::
        ~vector(local_100);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree(&local_130);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree(&local_160);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)local_190);
        std::vector<cali::QuerySpec::SortSpec,_std::allocator<cali::QuerySpec::SortSpec>_>::~vector
                  (local_1d8);
        std::vector<cali::QuerySpec::Condition,_std::allocator<cali::QuerySpec::Condition>_>::
        ~vector(&local_200);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_228);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_270.m_treenode.next);
        std::vector<cali::QuerySpec::AggregationOp,_std::allocator<cali::QuerySpec::AggregationOp>_>
        ::~vector((vector<cali::QuerySpec::AggregationOp,_std::allocator<cali::QuerySpec::AggregationOp>_>
                   *)local_278);
        cali::CalQLParser::~CalQLParser((CalQLParser *)&local_3c8);
        pCVar19 = cali::ChannelController::channel_body(local_348);
        pCVar7 = local_3a8;
        local_aggregate("aggregate count(),sum(loop.iterations) where loop group by loop",&local_68,
                        pCVar19,local_3a8,&local_2f8);
        (*(code *)(((LockfreeIntrusiveTree<cali::Node> *)local_390._24_8_)->m_me->m_treenode).head.
                  _M_b._M_p)(local_390._24_8_,pCVar7,&local_2f8);
        local_2a8.super__Function_base._M_functor._M_unused._M_object = local_2c8;
        local_2c8._0_8_ = (Node *)0x0;
        local_2c8._8_8_ = (Node *)0x0;
        local_2c8._16_8_ = (pointer)0x0;
        local_2a8.super__Function_base._M_functor._8_8_ = 0;
        local_2a8._M_invoker =
             std::
             _Function_handler<void_(cali::CaliperMetadataAccessInterface_&,_const_std::vector<cali::Entry,_std::allocator<cali::Entry>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Caliper/src/caliper/controllers/SpotController.cpp:359:39)>
             ::_M_invoke;
        local_2a8.super__Function_base._M_manager =
             std::
             _Function_handler<void_(cali::CaliperMetadataAccessInterface_&,_const_std::vector<cali::Entry,_std::allocator<cali::Entry>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Caliper/src/caliper/controllers/SpotController.cpp:359:39)>
             ::_M_manager;
        cali::Aggregator::flush(&local_2f8,&pCVar7->super_CaliperMetadataAccessInterface,&local_2a8)
        ;
        if (local_2a8.super__Function_base._M_manager != (_Manager_type)0x0) {
          (*local_2a8.super__Function_base._M_manager)
                    ((_Any_data *)&local_2a8,(_Any_data *)&local_2a8,__destroy_functor);
        }
        local_70 = (Node *)local_2c8._8_8_;
        if (local_2c8._0_8_ == local_2c8._8_8_) {
          poVar16 = (ostream *)local_280;
          std::ofstream::ofstream(poVar16);
          local_80 = 1;
          iVar11 = cali::Log::verbosity();
          if (local_80 <= iVar11) {
            poVar16 = cali::Log::get_stream((Log *)local_280);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar16,"[spot controller]: No instrumented loops found",0x2e);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar16 + -0x18) + (char)poVar16);
          std::ostream::put((char)poVar16);
          std::ostream::flush();
          local_280 = (undefined1  [8])local_328;
          *(undefined8 *)(local_280 + local_328[-1].m_attribute) = local_330;
          std::filebuf::~filebuf((filebuf *)local_278);
          std::ios_base::~ios_base((ios_base *)(local_190 + 8));
        }
        else {
          local_300 = local_348 + 1;
          local_78 = (Attribute *)((long)this + 0x88);
          pNVar18 = (Node *)local_2c8._0_8_;
          do {
            uVar6 = local_390._24_8_;
            if (0 < *(int *)&(pNVar18->m_treenode).next) {
              iVar11 = (*(code *)(((LockfreeIntrusiveTree<cali::Node> *)local_390._24_8_)->m_me->
                                 m_treenode).parent)(local_390._24_8_);
              iVar13 = (*(code *)(((LockfreeIntrusiveTree<cali::Node> *)uVar6)->m_me->m_treenode).
                                 parent)(uVar6,(ulong)*(uint *)((long)&(pNVar18->m_treenode).next +
                                                               4));
              (*(code *)(((LockfreeIntrusiveTree<cali::Node> *)uVar6)->m_me->m_treenode).next)
                        (local_3a0,uVar6,pNVar18);
              if (0 < iVar11) {
                bVar10 = cali::ConfigManager::Options::is_set(local_340,"timeseries.maxrows");
                iVar14 = 0x14;
                if (bVar10) {
                  cali::ConfigManager::Options::get_abi_cxx11_
                            ((string *)&local_3c8,local_340,"timeseries.maxrows","");
                  local_280 = (undefined1  [8])&local_270;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)local_280,local_3c8._M_unused._M_object,
                             (code *)(local_3c8._8_8_ + (long)local_3c8._M_unused._0_8_));
                  iVar14 = cali::StringConverter::to_int((StringConverter *)local_280,(bool *)0x0);
                  if (local_280 != (undefined1  [8])&local_270) {
                    operator_delete((void *)local_280,
                                    CONCAT35(local_270.super_LockfreeIntrusiveTree<cali::Node>.m_me.
                                             _5_3_,local_270.super_LockfreeIntrusiveTree<cali::Node>
                                                   .m_me._0_5_) + 1);
                  }
                  if ((code **)local_3c8._M_unused._0_8_ != &local_3b8) {
                    operator_delete(local_3c8._M_unused._M_object,(ulong)(local_3b8 + 1));
                  }
                }
                if (iVar14 < 1) {
                  iVar14 = iVar13;
                }
                local_390._32_4_ = 1;
                if (iVar14 < iVar13) {
                  local_390._32_4_ = iVar11 / iVar14;
                }
                local_3e8._M_unused._M_object = &local_3d8;
                local_368.mP.
                super___shared_ptr<cali::Aggregator::AggregatorImpl,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr = (element_type *)0xf1;
                paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)std::__cxx11::string::_M_create
                                       ((ulong *)local_3e8._M_pod_data,(ulong)&local_368);
                peVar8 = local_368.mP.
                         super___shared_ptr<cali::Aggregator::AggregatorImpl,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr;
                local_3d8._M_allocated_capacity._0_5_ =
                     SUB85(local_368.mP.
                           super___shared_ptr<cali::Aggregator::AggregatorImpl,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr,0);
                local_3d8._M_allocated_capacity._5_3_ =
                     (undefined3)
                     ((ulong)local_368.mP.
                             super___shared_ptr<cali::Aggregator::AggregatorImpl,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr >> 0x28);
                local_3e8._M_unused._0_8_ = (undefined8)paVar21;
                memcpy(paVar21,
                       " select cali.channel,loop,block,max(sum#loop.iterations) as \"Iterations\" unit iterations,max(scale#time.duration.ns) as \"Time (s)\" unit sec,avg(ratio#loop.iterations/time.duration.ns) as \"Iter/s\" unit iter/s group by cali.channel,loop,block "
                       ,0xf1);
                local_3e8._8_8_ = peVar8;
                paVar21->_M_local_buf[(long)peVar8] = '\0';
                cali::ConfigManager::Options::build_query
                          ((string *)&local_3c8,(Options *)local_300,"cross",(string *)&local_3e8);
                pCVar7 = local_3a8;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3e8._M_unused._0_8_ != &local_3d8) {
                  operator_delete(local_3e8._M_unused._M_object,
                                  CONCAT35(local_3d8._M_allocated_capacity._5_3_,
                                           local_3d8._M_allocated_capacity._0_5_) + 1);
                }
                parse_spec((QuerySpec *)local_280,(char *)local_3c8._M_unused._0_8_);
                if ((code **)local_3c8._M_unused._0_8_ != &local_3b8) {
                  operator_delete(local_3c8._M_unused._M_object,(ulong)(local_3b8 + 1));
                }
                cali::Aggregator::Aggregator(&local_2e8,(QuerySpec *)local_280);
                cali::CaliperMetadataDB::add_attribute_aliases
                          (pCVar7,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)&local_160);
                cali::CaliperMetadataDB::add_attribute_units
                          (local_3a8,
                           (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&local_130);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_368,(char *)local_3a0._0_8_,
                           (allocator<char> *)(local_390 + 0x27));
                __val = 1;
                if (1 < (int)local_390._32_4_) {
                  __val = local_390._32_4_;
                }
                local_3e8._M_unused._M_member_pointer = 0x9f;
                local_3c8._M_unused._M_object = &local_3b8;
                __dest = (code **)std::__cxx11::string::_M_create
                                            ((ulong *)local_3c8._M_pod_data,(ulong)&local_3e8);
                uVar6 = local_3e8._M_unused._0_8_;
                local_3b8 = (code *)local_3e8._M_unused._0_8_;
                local_3c8._M_unused._M_object = __dest;
                memcpy(__dest,
                       " select cali.channel,loop,block,scale(time.duration.ns,1e-9),sum(loop.iterations),ratio(loop.iterations,time.duration.ns,1e9) group by cali.channel,loop,block "
                       ,0x9f);
                local_3c8._8_8_ = uVar6;
                *(code *)((long)__dest + uVar6) = (code)0x0;
                pcVar22 = (char *)std::__cxx11::string::append(local_3c8._M_pod_data);
                __len = 1;
                if (9 < (int)local_390._32_4_) {
                  uVar26 = (ulong)__val;
                  uVar9 = 4;
                  do {
                    __len = uVar9;
                    uVar15 = (uint)uVar26;
                    if (uVar15 < 100) {
                      __len = __len - 2;
                      goto LAB_002182f2;
                    }
                    if (uVar15 < 1000) {
                      __len = __len - 1;
                      goto LAB_002182f2;
                    }
                    if (uVar15 < 10000) goto LAB_002182f2;
                    uVar26 = uVar26 / 10000;
                    uVar9 = __len + 4;
                  } while (99999 < uVar15);
                  __len = __len + 1;
                }
LAB_002182f2:
                local_3e8._M_unused._M_object = &local_3d8;
                std::__cxx11::string::_M_construct((ulong)&local_3e8,(char)__len);
                std::__detail::__to_chars_10_impl<unsigned_int>
                          ((char *)local_3e8._M_unused._0_8_,__len,__val);
                pcVar22 = (char *)std::__cxx11::string::_M_append
                                            (pcVar22,local_3e8._M_unused._M_member_pointer);
                std::__cxx11::string::append(pcVar22);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3e8._M_unused._0_8_ != &local_3d8) {
                  operator_delete(local_3e8._M_unused._M_object,
                                  CONCAT35(local_3d8._M_allocated_capacity._5_3_,
                                           local_3d8._M_allocated_capacity._0_5_) + 1);
                }
                pcVar22 = (char *)std::__cxx11::string::append(local_3c8._M_pod_data);
                pcVar22 = (char *)std::__cxx11::string::_M_append
                                            (pcVar22,(ulong)local_368.mP.
                                                                                                                        
                                                  super___shared_ptr<cali::Aggregator::AggregatorImpl,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr);
                std::__cxx11::string::append(pcVar22);
                cali::ConfigManager::Options::build_query
                          ((string *)&local_3e8,(Options *)local_300,"local",(string *)&local_3c8);
                cali::ChannelController::channel(local_348);
                if ((local_310.mP.super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                   (0 < (local_310.mP.
                         super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi)->_M_use_count)) {
                  local_aggregate((char *)local_3e8._M_unused._0_8_,&local_68,
                                  local_310.mP.
                                  super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_ptr,local_3a8,&local_2e8);
                }
                cali::Channel::~Channel(&local_310);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3e8._M_unused._0_8_ != &local_3d8) {
                  operator_delete(local_3e8._M_unused._M_object,
                                  CONCAT35(local_3d8._M_allocated_capacity._5_3_,
                                           local_3d8._M_allocated_capacity._0_5_) + 1);
                }
                if ((code **)local_3c8._M_unused._0_8_ != &local_3b8) {
                  operator_delete(local_3c8._M_unused._M_object,(ulong)(local_3b8 + 1));
                }
                if (local_368.mP.
                    super___shared_ptr<cali::Aggregator::AggregatorImpl,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr != (element_type *)&local_358) {
                  operator_delete(local_368.mP.
                                  super___shared_ptr<cali::Aggregator::AggregatorImpl,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr,CONCAT62(local_358._M_allocated_capacity._2_6_,
                                                   local_358._M_allocated_capacity._0_2_) + 1);
                }
                (*(code *)(((LockfreeIntrusiveTree<cali::Node> *)local_390._24_8_)->m_me->m_treenode
                          ).head._M_b._M_p)(local_390._24_8_,local_3a8,&local_2e8);
                iVar11 = (*(code *)((LockfreeIntrusiveTree<cali::Node> *)local_390._24_8_)->m_me->
                                   m_id)();
                if (iVar11 == 0) {
                  *(size_type *)(local_390._16_8_ + 0x50) = 0;
                  *(((string *)(local_390._16_8_ + 0x48))->_M_dataplus)._M_p = '\0';
                  paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT35(local_270.super_LockfreeIntrusiveTree<cali::Node>.m_me._5_3_
                                        ,local_270.super_LockfreeIntrusiveTree<cali::Node>.m_me.
                                         _0_5_);
                  pAVar27 = extraout_RDX_03;
                  for (auVar28 = local_278; auVar28 != (undefined1  [8])paVar21;
                      auVar28 = (undefined1  [8])((long)auVar28 + 0x38)) {
                    if (*(size_type *)(local_390._16_8_ + 0x50) != 0) {
                      std::__cxx11::string::append((char *)((long)this + 0x48U));
                      pAVar27 = extraout_RDX_04;
                    }
                    cali::Aggregator::get_aggregation_attribute_name_abi_cxx11_
                              ((string *)&local_3c8,(Aggregator *)auVar28,pAVar27);
                    std::__cxx11::string::_M_append
                              ((char *)((long)this + 0x48U),local_3c8._M_unused._M_member_pointer);
                    pAVar27 = extraout_RDX_05;
                    if ((code **)local_3c8._M_unused._0_8_ != &local_3b8) {
                      operator_delete(local_3c8._M_unused._M_object,(ulong)(local_3b8 + 1));
                      pAVar27 = extraout_RDX_06;
                    }
                  }
                  local_3e8._M_unused._M_object = &DAT_a74657304;
                  local_3e8._8_8_ = (long)",timeseries" + 1;
                  pNVar23 = cali::CaliperMetadataDB::make_tree_entry
                                      (local_3a8,1,local_78,(Variant *)&local_3e8,(Node *)0x0);
                  pcVar3 = (code *)(pNVar23->m_data).m_v.type_and_size;
                  aVar2 = (pNVar23->m_data).m_v.value;
                  local_3b8 = (code *)0x0;
                  pcStack_3b0 = (code *)0x0;
                  local_3c8._M_unused._M_object = (void *)0x0;
                  local_3c8._8_8_ = (code *)0x0;
                  local_3c8._M_unused._M_object = operator_new(0x20);
                  *(CaliWriter **)local_3c8._M_unused._0_8_ = &local_320;
                  *(Node **)((long)local_3c8._M_unused._0_8_ + 8) = pNVar23;
                  *(code **)((long)local_3c8._M_unused._0_8_ + 0x10) = pcVar3;
                  *(anon_union_8_7_33918203_for_value *)((long)local_3c8._M_unused._0_8_ + 0x18) =
                       aVar2;
                  pcStack_3b0 = std::
                                _Function_handler<void_(cali::CaliperMetadataAccessInterface_&,_const_std::vector<cali::Entry,_std::allocator<cali::Entry>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Caliper/src/caliper/controllers/SpotController.cpp:330:21)>
                                ::_M_invoke;
                  local_3b8 = std::
                              _Function_handler<void_(cali::CaliperMetadataAccessInterface_&,_const_std::vector<cali::Entry,_std::allocator<cali::Entry>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Caliper/src/caliper/controllers/SpotController.cpp:330:21)>
                              ::_M_manager;
                  cali::Aggregator::flush
                            (&local_2e8,&local_3a8->super_CaliperMetadataAccessInterface,
                             (SnapshotProcessFn *)&local_3c8);
                  if (local_3b8 != (code *)0x0) {
                    (*local_3b8)(&local_3c8,&local_3c8,3);
                  }
                }
                cali::Aggregator::~Aggregator(&local_2e8);
                std::
                vector<cali::QuerySpec::PreprocessSpec,_std::allocator<cali::QuerySpec::PreprocessSpec>_>
                ::~vector(local_100);
                std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::~_Rb_tree(&local_130);
                std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::~_Rb_tree(&local_160);
                std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)local_190);
                std::vector<cali::QuerySpec::SortSpec,_std::allocator<cali::QuerySpec::SortSpec>_>::
                ~vector(local_1d8);
                std::vector<cali::QuerySpec::Condition,_std::allocator<cali::QuerySpec::Condition>_>
                ::~vector(&local_200);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_228);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&local_270.m_treenode.next);
                std::
                vector<cali::QuerySpec::AggregationOp,_std::allocator<cali::QuerySpec::AggregationOp>_>
                ::~vector((vector<cali::QuerySpec::AggregationOp,_std::allocator<cali::QuerySpec::AggregationOp>_>
                           *)local_278);
              }
              if ((Node *)local_3a0._0_8_ != (Node *)local_390) {
                operator_delete((void *)local_3a0._0_8_,(ulong)(local_390._0_8_ + 1));
              }
            }
            pNVar18 = (Node *)&(pNVar18->m_treenode).head;
          } while (pNVar18 != local_70);
        }
        std::
        vector<(anonymous_namespace)::LoopInfo,_std::allocator<(anonymous_namespace)::LoopInfo>_>::
        ~vector((vector<(anonymous_namespace)::LoopInfo,_std::allocator<(anonymous_namespace)::LoopInfo>_>
                 *)local_2c8);
        cali::Aggregator::~Aggregator(&local_2f8);
        this = (SpotController *)local_390._16_8_;
        if (local_338 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_338);
        }
      }
      if (local_2d8.mP.
          super___shared_ptr<cali::ConfigManager::ConfigManagerImpl,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_2d8.mP.
                   super___shared_ptr<cali::ConfigManager::ConfigManagerImpl,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
    }
    iVar11 = (*(code *)((LockfreeIntrusiveTree<cali::Node> *)local_390._24_8_)->m_me->m_id)();
    if (iVar11 == 0) {
      pCVar19 = cali::ChannelController::channel_body((ChannelController *)this);
      cali::Caliper::get_globals
                ((vector<cali::Entry,_std::allocator<cali::Entry>_> *)local_280,&local_68,pCVar19);
      cali::CaliperMetadataDB::import_globals
                (&local_48,local_3a8,&local_68.super_CaliperMetadataAccessInterface,
                 (vector<cali::Entry,_std::allocator<cali::Entry>_> *)local_280);
      if (local_48.super__Vector_base<cali::Entry,_std::allocator<cali::Entry>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_48.super__Vector_base<cali::Entry,_std::allocator<cali::Entry>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_48.super__Vector_base<cali::Entry,_std::allocator<cali::Entry>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_48.super__Vector_base<cali::Entry,_std::allocator<cali::Entry>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_280 != (undefined1  [8])0x0) {
        operator_delete((void *)local_280,
                        CONCAT35(local_270.super_LockfreeIntrusiveTree<cali::Node>.m_me._5_3_,
                                 local_270.super_LockfreeIntrusiveTree<cali::Node>.m_me._0_5_) -
                        (long)local_280);
      }
      local_280 = (undefined1  [8])&local_270;
      local_270.super_LockfreeIntrusiveTree<cali::Node>.m_me._0_5_ = 0x6f69676572;
      local_270.super_LockfreeIntrusiveTree<cali::Node>.m_me._5_3_ = 0x72706e;
      local_270.super_LockfreeIntrusiveTree<cali::Node>.m_node._0_5_ = 0x656c69666f;
      local_278 = (undefined1  [8])0xd;
      local_270.super_LockfreeIntrusiveTree<cali::Node>.m_node._5_1_ = '\0';
      local_3c8._8_8_ = (code *)0x0;
      local_3b8 = (code *)((ulong)local_3b8 & 0xffffffffffffff00);
      local_3c8._M_unused._M_object = &local_3b8;
      cali::ConfigManager::Options::enabled_options_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_3e8,local_340);
      uVar6 = local_3e8._8_8_;
      if (local_3e8._M_unused._M_object != (void *)local_3e8._8_8_) {
        uVar29 = local_3e8._M_unused._0_8_;
        do {
          if ((code *)local_3c8._8_8_ != (code *)0x0) {
            std::__cxx11::string::append(local_3c8._M_pod_data);
          }
          std::__cxx11::string::_M_append(local_3c8._M_pod_data,*(ulong *)uVar29);
          iVar11 = std::__cxx11::string::compare((char *)uVar29);
          if (iVar11 == 0) {
            std::__cxx11::string::append(local_280);
          }
          uVar29 = uVar29 + 0x20;
        } while (uVar29 != uVar6);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_3e8);
      pCVar7 = local_3a8;
      local_3d8._M_allocated_capacity._0_5_ = 0x2e746f7073;
      local_3d8._M_allocated_capacity._5_3_ = 0x74656d;
      local_3d8._8_4_ = 0x73636972;
      local_3e8._8_8_ = 0xc;
      local_3d8._M_local_buf[0xc] = '\0';
      local_3e8._M_unused._M_object = &local_3d8;
      local_368.mP.super___shared_ptr<cali::Aggregator::AggregatorImpl,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)
               cali::CaliperMetadataDB::create_attribute
                         (local_3a8,(string *)&local_3e8,CALI_TYPE_STRING,0x200,0,(Attribute *)0x0,
                          (Variant *)0x0);
      uVar6 = local_390._16_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3e8._M_unused._0_8_ != &local_3d8) {
        operator_delete(local_3e8._M_unused._M_object,
                        CONCAT35(local_3d8._M_allocated_capacity._5_3_,
                                 local_3d8._M_allocated_capacity._0_5_) + 1);
      }
      local_3a0._0_8_ = (pointer)0x17;
      local_3e8._M_unused._M_object = &local_3d8;
      local_3e8._M_unused._0_8_ =
           (undefined8)
           std::__cxx11::string::_M_create((ulong *)local_3e8._M_pod_data,(ulong)local_3a0);
      local_3d8._M_allocated_capacity._0_5_ = (undefined5)local_3a0._0_8_;
      local_3d8._M_allocated_capacity._5_3_ = SUB83(local_3a0._0_8_,5);
      *(undefined8 *)local_3e8._M_unused._0_8_ = 0x6d69742e746f7073;
      *(char *)((long)local_3e8._M_unused._0_8_ + 8) = 'e';
      *(char *)((long)local_3e8._M_unused._0_8_ + 9) = 's';
      *(char *)((long)local_3e8._M_unused._0_8_ + 10) = 'e';
      *(char *)((long)local_3e8._M_unused._0_8_ + 0xb) = 'r';
      *(char *)((long)local_3e8._M_unused._0_8_ + 0xc) = 'i';
      *(char *)((long)local_3e8._M_unused._0_8_ + 0xd) = 'e';
      *(char *)((long)local_3e8._M_unused._0_8_ + 0xe) = 's';
      *(char *)((long)local_3e8._M_unused._0_8_ + 0xf) = '.';
      *(char *)((long)local_3e8._M_unused._0_8_ + 0xf) = '.';
      *(char *)((long)local_3e8._M_unused._0_8_ + 0x10) = 'm';
      *(char *)((long)local_3e8._M_unused._0_8_ + 0x11) = 'e';
      *(char *)((long)local_3e8._M_unused._0_8_ + 0x12) = 't';
      *(char *)((long)local_3e8._M_unused._0_8_ + 0x13) = 'r';
      *(char *)((long)local_3e8._M_unused._0_8_ + 0x14) = 'i';
      *(char *)((long)local_3e8._M_unused._0_8_ + 0x15) = 'c';
      *(char *)((long)local_3e8._M_unused._0_8_ + 0x16) = 's';
      local_3e8._8_8_ = local_3a0._0_8_;
      *(char *)((long)local_3e8._M_unused._0_8_ + local_3a0._0_8_) = '\0';
      local_2a8.super__Function_base._M_functor._M_unused._0_8_ =
           (undefined8)
           cali::CaliperMetadataDB::create_attribute
                     (pCVar7,(string *)&local_3e8,CALI_TYPE_STRING,0x200,0,(Attribute *)0x0,
                      (Variant *)0x0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3e8._M_unused._0_8_ != &local_3d8) {
        operator_delete(local_3e8._M_unused._M_object,
                        CONCAT35(local_3d8._M_allocated_capacity._5_3_,
                                 local_3d8._M_allocated_capacity._0_5_) + 1);
      }
      local_3a0._0_8_ = (pointer)0x13;
      local_3e8._M_unused._M_object = &local_3d8;
      local_3e8._M_unused._0_8_ =
           (undefined8)
           std::__cxx11::string::_M_create((ulong *)local_3e8._M_pod_data,(ulong)local_3a0);
      local_3d8._M_allocated_capacity._0_5_ = (undefined5)local_3a0._0_8_;
      local_3d8._M_allocated_capacity._5_3_ = SUB83(local_3a0._0_8_,5);
      *(undefined8 *)local_3e8._M_unused._0_8_ = 0x726f662e746f7073;
      *(char *)((long)local_3e8._M_unused._0_8_ + 8) = 'm';
      *(char *)((long)local_3e8._M_unused._0_8_ + 9) = 'a';
      *(char *)((long)local_3e8._M_unused._0_8_ + 10) = 't';
      *(char *)((long)local_3e8._M_unused._0_8_ + 0xb) = '.';
      *(char *)((long)local_3e8._M_unused._0_8_ + 0xc) = 'v';
      *(char *)((long)local_3e8._M_unused._0_8_ + 0xd) = 'e';
      *(char *)((long)local_3e8._M_unused._0_8_ + 0xe) = 'r';
      *(char *)((long)local_3e8._M_unused._0_8_ + 0xf) = 's';
      *(char *)((long)local_3e8._M_unused._0_8_ + 0xf) = 's';
      *(char *)((long)local_3e8._M_unused._0_8_ + 0x10) = 'i';
      *(char *)((long)local_3e8._M_unused._0_8_ + 0x11) = 'o';
      *(char *)((long)local_3e8._M_unused._0_8_ + 0x12) = 'n';
      local_3e8._8_8_ = local_3a0._0_8_;
      *(char *)((long)local_3e8._M_unused._0_8_ + local_3a0._0_8_) = '\0';
      local_2c8._0_8_ =
           cali::CaliperMetadataDB::create_attribute
                     (pCVar7,(string *)&local_3e8,CALI_TYPE_INT,0x200,0,(Attribute *)0x0,
                      (Variant *)0x0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3e8._M_unused._0_8_ != &local_3d8) {
        operator_delete(local_3e8._M_unused._M_object,
                        CONCAT35(local_3d8._M_allocated_capacity._5_3_,
                                 local_3d8._M_allocated_capacity._0_5_) + 1);
      }
      local_3d8._M_allocated_capacity._0_5_ = 0x2e746f7073;
      local_3d8._M_allocated_capacity._5_3_ = 0x74706f;
      local_3d8._8_4_ = 0x736e6f69;
      local_3e8._8_8_ = 0xc;
      local_3d8._M_local_buf[0xc] = '\0';
      local_3e8._M_unused._M_object = &local_3d8;
      local_3a0._0_8_ =
           cali::CaliperMetadataDB::create_attribute
                     (pCVar7,(string *)&local_3e8,CALI_TYPE_STRING,0x200,0,(Attribute *)0x0,
                      (Variant *)0x0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3e8._M_unused._0_8_ != &local_3d8) {
        operator_delete(local_3e8._M_unused._M_object,
                        CONCAT35(local_3d8._M_allocated_capacity._5_3_,
                                 local_3d8._M_allocated_capacity._0_5_) + 1);
      }
      local_3d8._M_allocated_capacity._0_5_ = 0x2e746f7073;
      local_3d8._M_allocated_capacity._5_3_ = 0x616863;
      local_3d8._8_4_ = 0x6c656e6e;
      local_3d8._M_local_buf[0xc] = 's';
      local_3e8._8_8_ = 0xd;
      local_3d8._M_local_buf[0xd] = '\0';
      local_3e8._M_unused._M_object = &local_3d8;
      local_310.mP.super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           cali::CaliperMetadataDB::create_attribute
                     (pCVar7,(string *)&local_3e8,CALI_TYPE_STRING,0x200,0,(Attribute *)0x0,
                      (Variant *)0x0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3e8._M_unused._0_8_ != &local_3d8) {
        operator_delete(local_3e8._M_unused._M_object,
                        CONCAT35(local_3d8._M_allocated_capacity._5_3_,
                                 local_3d8._M_allocated_capacity._0_5_) + 1);
      }
      pbVar4 = (byte *)(((string *)(uVar6 + 0x28))->_M_dataplus)._M_p;
      sVar24 = strlen((char *)pbVar4);
      local_3e8._M_unused._0_8_ =
           (undefined8)
           ((sVar24 << 0x20) +
            (ulong)(((uint)pbVar4[sVar24 - 1] |
                    (uint)pbVar4[sVar24 >> 1] << 8 | (uint)*pbVar4 << 0x10) << 8) + 4);
      local_3e8._8_8_ = pbVar4;
      cali::CaliperMetadataDB::set_global(pCVar7,(Attribute *)&local_368,(Variant *)&local_3e8);
      pbVar4 = (byte *)(((string *)(uVar6 + 0x48))->_M_dataplus)._M_p;
      sVar24 = strlen((char *)pbVar4);
      local_3e8._M_unused._0_8_ =
           (undefined8)
           ((sVar24 << 0x20) +
            (ulong)(((uint)pbVar4[sVar24 - 1] |
                    (uint)pbVar4[sVar24 >> 1] << 8 | (uint)*pbVar4 << 0x10) << 8) + 4);
      local_3e8._8_8_ = pbVar4;
      cali::CaliperMetadataDB::set_global(pCVar7,(Attribute *)&local_2a8,(Variant *)&local_3e8);
      local_3e8._M_unused._M_member_pointer = 2;
      local_3e8._8_8_ = 2;
      cali::CaliperMetadataDB::set_global(pCVar7,(Attribute *)local_2c8,(Variant *)&local_3e8);
      uVar29 = local_3c8._M_unused._0_8_;
      sVar24 = strlen((char *)local_3c8._M_unused._0_8_);
      local_3e8._M_unused._0_8_ =
           (undefined8)
           ((sVar24 << 0x20) +
            (ulong)(((uint)*(byte *)(uVar29 + (sVar24 - 1)) |
                    (uint)*(byte *)(uVar29 + (sVar24 >> 1)) << 8 | (uint)*(byte *)uVar29 << 0x10) <<
                   8) + 4);
      local_3e8._8_8_ = uVar29;
      cali::CaliperMetadataDB::set_global(pCVar7,(Attribute *)local_3a0,(Variant *)&local_3e8);
      auVar28 = local_280;
      sVar24 = strlen((char *)local_280);
      local_3e8._M_unused._0_8_ =
           (undefined8)
           ((sVar24 << 0x20) +
            (ulong)(((uint)*(byte *)((long)auVar28 + (sVar24 - 1)) |
                    (uint)*(byte *)((long)auVar28 + (sVar24 >> 1)) << 8 |
                    (uint)*(byte *)auVar28 << 0x10) << 8) + 4);
      local_3e8._8_8_ = auVar28;
      cali::CaliperMetadataDB::set_global(pCVar7,(Attribute *)&local_310,(Variant *)&local_3e8);
      if ((code **)local_3c8._M_unused._0_8_ != &local_3b8) {
        operator_delete(local_3c8._M_unused._M_object,(ulong)(local_3b8 + 1));
      }
      if (local_280 != (undefined1  [8])&local_270) {
        operator_delete((void *)local_280,
                        CONCAT35(local_270.super_LockfreeIntrusiveTree<cali::Node>.m_me._5_3_,
                                 local_270.super_LockfreeIntrusiveTree<cali::Node>.m_me._0_5_) + 1);
      }
      cali::CaliperMetadataDB::get_globals
                ((vector<cali::Entry,_std::allocator<cali::Entry>_> *)local_280,pCVar7);
      cali::CaliWriter::write_globals
                (&local_320,&pCVar7->super_CaliperMetadataAccessInterface,
                 (vector<cali::Entry,_std::allocator<cali::Entry>_> *)local_280);
      if (local_280 != (undefined1  [8])0x0) {
        operator_delete((void *)local_280,
                        CONCAT35(local_270.super_LockfreeIntrusiveTree<cali::Node>.m_me._5_3_,
                                 local_270.super_LockfreeIntrusiveTree<cali::Node>.m_me._0_5_) -
                        (long)local_280);
      }
      poVar16 = (ostream *)local_280;
      std::ofstream::ofstream(poVar16);
      local_80 = 1;
      iVar11 = cali::Log::verbosity();
      if (local_80 <= iVar11) {
        poVar16 = cali::Log::get_stream((Log *)local_280);
      }
      cali::ChannelController::name_abi_cxx11_((string *)&local_3c8,(ChannelController *)uVar6);
      poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar16,(char *)local_3c8._M_unused._0_8_,local_3c8._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,": Wrote ",8);
      cali::CaliWriter::num_written(&local_320);
      poVar16 = std::ostream::_M_insert<unsigned_long>((ulong)poVar16);
      std::__ostream_insert<char,std::char_traits<char>>(poVar16," records.",9);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar16 + -0x18) + (char)poVar16);
      std::ostream::put((char)poVar16);
      std::ostream::flush();
      if ((code **)local_3c8._M_unused._0_8_ != &local_3b8) {
        operator_delete(local_3c8._M_unused._M_object,(ulong)(local_3b8 + 1));
      }
      local_280 = (undefined1  [8])local_328;
      *(undefined8 *)(local_280 + local_328[-1].m_attribute) = local_330;
      std::filebuf::~filebuf((filebuf *)local_278);
      std::ios_base::~ios_base((ios_base *)(local_190 + 8));
    }
    cali::CaliWriter::~CaliWriter(&local_320);
  }
  else {
    std::ofstream::ofstream(poVar16);
    local_80 = 0;
    iVar11 = cali::Log::verbosity();
    if (local_80 <= iVar11) {
      poVar16 = cali::Log::get_stream((Log *)local_280);
    }
    cali::ChannelController::name_abi_cxx11_((string *)&local_3c8,(ChannelController *)this);
    poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar16,(char *)local_3c8._M_unused._0_8_,local_3c8._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar16,": SpotController: channel not instantiated\n",0x2b);
    if ((code **)local_3c8._M_unused._0_8_ != &local_3b8) {
      operator_delete(local_3c8._M_unused._M_object,(ulong)(local_3b8 + 1));
    }
    local_280 = (undefined1  [8])_VTT;
    *(undefined8 *)(local_280 + _VTT[-1].m_attribute) = ___throw_bad_array_new_length;
    std::filebuf::~filebuf((filebuf *)local_278);
    std::ios_base::~ios_base((ios_base *)(local_190 + 8));
  }
  return;
}

Assistant:

void collective_flush(OutputStream& stream, Comm& comm) override
    {
        if (!is_instantiated()) {
            Log(0).stream() << name() << ": SpotController: channel not instantiated\n";
            return;
        }

        Log(1).stream() << name() << ": Flushing Caliper data" << std::endl;

        if (stream.type() == OutputStream::None)
            stream = create_output_stream();

        Caliper    c;
        CaliWriter writer(stream);

        flush_regionprofile(c, writer, comm);

        if (m_opts.is_enabled("timeseries"))
            flush_timeseries(c, writer, comm);

        if (comm.rank() == 0) {
            m_db.import_globals(c, c.get_globals(channel_body()));
            save_spot_metadata();
            writer.write_globals(m_db, m_db.get_globals());

            Log(1).stream() << name() << ": Wrote " << writer.num_written() << " records." << std::endl;
        }
    }